

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsharedmemory.cpp
# Opt level: O2

void __thiscall QSharedMemory::setNativeKey(QSharedMemory *this,QNativeIpcKey *key)

{
  QNativeIpcKey *rhs;
  QSharedMemoryPrivate *this_00;
  bool bVar1;
  long in_FS_OFFSET;
  QLatin1String local_68;
  QArrayDataPointer<char16_t> local_58;
  QArrayDataPointer<char16_t> local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QSharedMemoryPrivate *)(this->super_QObject).d_ptr.d;
  rhs = &this_00->nativeKey;
  bVar1 = ::comparesEqual(key,rhs);
  if ((!bVar1) || ((key->key).d.size != 0)) {
    bVar1 = isKeyTypeSupported((key->typeAndFlags).type);
    if (bVar1) {
      if ((this->super_QObject).d_ptr.d[1].children.d.size != 0) {
        detach(this);
      }
      QSharedMemoryPrivate::cleanHandle(this_00);
      if ((key->typeAndFlags).type == (this_00->nativeKey).typeAndFlags.type) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
          QNativeIpcKey::operator=(rhs,key);
          return;
        }
        goto LAB_00207f57;
      }
      QSharedMemoryPrivate::destructBackend(this_00);
      QNativeIpcKey::operator=(rhs,key);
      if ((this_00->nativeKey).typeAndFlags.type != PosixRealtime) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
          (this_00->backend).d.sysv.nativeKeyFile.d.size = 0;
          *(undefined8 *)((long)&(this_00->backend).d + 0x18) = 0;
          (this_00->backend).d.sysv.nativeKeyFile.d.d = (Data *)0x0;
          (this_00->backend).d.sysv.nativeKeyFile.d.ptr = (char *)0x0;
          return;
        }
        goto LAB_00207f57;
      }
      (this_00->backend).d.posix.hand = -1;
    }
    else {
      tr((QString *)&local_58,"%1: unsupported key type",(char *)0x0,-1);
      local_68.m_size = 0x1b;
      local_68.m_data = "QSharedMemory::setNativeKey";
      QString::arg<QLatin1String,_true>
                ((QString *)&local_40,(QString *)&local_58,&local_68,0,(QChar)0x20);
      this_00->error = KeyError;
      QString::operator=(&this_00->errorString,(QString *)&local_40);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
LAB_00207f57:
  __stack_chk_fail();
}

Assistant:

void QSharedMemory::setNativeKey(const QNativeIpcKey &key)
{
    Q_D(QSharedMemory);
    if (key == d->nativeKey && key.isEmpty())
        return;
    if (!isKeyTypeSupported(key.type())) {
        d->setError(KeyError, tr("%1: unsupported key type")
                    .arg("QSharedMemory::setNativeKey"_L1));
        return;
    }

    if (isAttached())
        detach();
    d->cleanHandle();
    if (key.type() == d->nativeKey.type()) {
        // we can reuse the backend
        d->nativeKey = key;
    } else {
        // we must recreate the backend
        d->destructBackend();
        d->nativeKey = key;
        d->constructBackend();
    }
}